

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O0

UChar32 utext_next32_63(UText *ut)

{
  int iVar1;
  UBool UVar2;
  UChar32 supplementary;
  UChar32 trail;
  UChar32 c;
  UText *ut_local;
  
  if ((ut->chunkOffset < ut->chunkLength) ||
     (UVar2 = (*ut->pFuncs->access)(ut,ut->chunkNativeLimit,'\x01'), UVar2 != '\0')) {
    iVar1 = ut->chunkOffset;
    ut->chunkOffset = iVar1 + 1;
    ut_local._4_4_ = (uint)(ushort)ut->chunkContents[iVar1];
    if (((ut_local._4_4_ & 0xfffffc00) == 0xd800) &&
       (((ut->chunkOffset < ut->chunkLength ||
         (UVar2 = (*ut->pFuncs->access)(ut,ut->chunkNativeLimit,'\x01'), UVar2 != '\0')) &&
        (((ushort)ut->chunkContents[ut->chunkOffset] & 0xfffffc00) == 0xdc00)))) {
      ut_local._4_4_ =
           ut_local._4_4_ * 0x400 + (uint)(ushort)ut->chunkContents[ut->chunkOffset] + 0xfca02400;
      ut->chunkOffset = ut->chunkOffset + 1;
    }
  }
  else {
    ut_local._4_4_ = 0xffffffff;
  }
  return ut_local._4_4_;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
utext_next32(UText *ut) {
    UChar32       c;

    if (ut->chunkOffset >= ut->chunkLength) {
        if (ut->pFuncs->access(ut, ut->chunkNativeLimit, TRUE) == FALSE) {
            return U_SENTINEL;
        }
    }

    c = ut->chunkContents[ut->chunkOffset++];
    if (U16_IS_LEAD(c) == FALSE) {
        // Normal case, not supplementary.
        //   (A trail surrogate seen here is just returned as is, as a surrogate value.
        //    It cannot be part of a pair.)
        return c;
    }

    if (ut->chunkOffset >= ut->chunkLength) {
        if (ut->pFuncs->access(ut, ut->chunkNativeLimit, TRUE) == FALSE) {
            // c is an unpaired lead surrogate at the end of the text.
            // return it as it is.
            return c;
        }
    }
    UChar32 trail = ut->chunkContents[ut->chunkOffset];
    if (U16_IS_TRAIL(trail) == FALSE) {
        // c was an unpaired lead surrogate, not at the end of the text.
        // return it as it is (unpaired).  Iteration position is on the
        // following character, possibly in the next chunk, where the
        //  trail surrogate would have been if it had existed.
        return c;
    }

    UChar32 supplementary = U16_GET_SUPPLEMENTARY(c, trail);
    ut->chunkOffset++;   // move iteration position over the trail surrogate.
    return supplementary;
    }